

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteTextures(ColladaExporter *this)

{
  aiTexture *texture;
  pointer pcVar1;
  IOSystem *pIVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  aiScene *paVar6;
  long *plVar7;
  undefined4 extraout_var;
  runtime_error *this_00;
  uint uVar8;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  __string_type __str;
  string name;
  char str [1024];
  undefined1 local_530 [8];
  _Alloc_hider local_528;
  undefined1 local_520 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468 [2];
  long local_458 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  *local_440;
  char local_438;
  char local_437 [1031];
  IOStream *file;
  ulong uVar9;
  
  if (((this->mScene->mTextures != (aiTexture **)0x0) && (this->mScene->mNumTextures != 0)) &&
     (paVar6 = this->mScene, paVar6->mNumTextures != 0)) {
    local_448 = &this->mPath;
    local_440 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                 *)&this->textures;
    uVar18 = 0;
    do {
      texture = paVar6->mTextures[uVar18];
      if (texture != (aiTexture *)0x0) {
        uVar17 = (uint)uVar18;
        uVar8 = uVar17 + 1;
        uVar13 = 1;
        pcVar15 = &local_438;
        if ((int)uVar8 < 0) {
          local_438 = '-';
          uVar8 = ~uVar17;
          uVar13 = 2;
          pcVar15 = local_437;
        }
        uVar9 = (ulong)uVar8;
        iVar5 = 1000000000;
        bVar14 = false;
        do {
          pcVar16 = pcVar15;
          if (0x3ff < uVar13) break;
          lVar3 = (long)(int)uVar9 / (long)iVar5;
          uVar12 = (long)(int)uVar9 % (long)iVar5 & 0xffffffff;
          if (((bVar14) || (iVar5 == 1)) || ((int)lVar3 != 0)) {
            pcVar16 = pcVar15 + 1;
            uVar13 = uVar13 + 1;
            *pcVar15 = (char)lVar3 + '0';
            bVar14 = true;
            uVar9 = uVar12;
            pcVar15 = pcVar16;
            if (iVar5 != 1) goto LAB_00313af0;
            bVar4 = false;
            iVar5 = 1;
          }
          else {
LAB_00313af0:
            iVar5 = iVar5 / 10;
            bVar4 = true;
            pcVar16 = pcVar15;
          }
          pcVar15 = pcVar16;
        } while (bVar4);
        *pcVar16 = '\0';
        pcVar1 = (this->mFile)._M_dataplus._M_p;
        local_468[0] = local_458;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_468,pcVar1,pcVar1 + (this->mFile)._M_string_length);
        std::__cxx11::string::append((char *)local_468);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_468);
        local_4a8 = &local_498;
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_498 = *plVar10;
          lStack_490 = plVar7[3];
        }
        else {
          local_498 = *plVar10;
          local_4a8 = (long *)*plVar7;
        }
        local_4a0 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_4a8);
        local_488 = &local_478;
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_478 = *plVar10;
          lStack_470 = plVar7[3];
        }
        else {
          local_478 = *plVar10;
          local_488 = (long *)*plVar7;
        }
        local_480 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
        local_4e8 = &local_4d8;
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_4d8 = *plVar10;
          lStack_4d0 = plVar7[3];
        }
        else {
          local_4d8 = *plVar10;
          local_4e8 = (long *)*plVar7;
        }
        local_4e0 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_4e8);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_508.field_2._M_allocated_capacity = *psVar11;
          local_508.field_2._8_8_ = plVar7[3];
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        }
        else {
          local_508.field_2._M_allocated_capacity = *psVar11;
          local_508._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_508._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_508);
        local_530 = (undefined1  [8])local_520;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar11) {
          local_520._0_8_ = *psVar11;
          local_520._8_8_ = plVar7[3];
        }
        else {
          local_520._0_8_ = *psVar11;
          local_530 = (undefined1  [8])*plVar7;
        }
        local_528._M_p = (pointer)plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append(local_530);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_4c8.field_2._M_allocated_capacity = *psVar11;
          local_4c8.field_2._8_8_ = plVar7[3];
          local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        }
        else {
          local_4c8.field_2._M_allocated_capacity = *psVar11;
          local_4c8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_4c8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_530 != (undefined1  [8])local_520) {
          operator_delete((void *)local_530,local_520._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if (local_488 != &local_478) {
          operator_delete(local_488,local_478 + 1);
        }
        if (local_4a8 != &local_498) {
          operator_delete(local_4a8,local_498 + 1);
        }
        if (local_468[0] != local_458) {
          operator_delete(local_468[0],local_458[0] + 1);
        }
        pIVar2 = this->mIOSystem;
        (*pIVar2->_vptr_IOSystem[3])(pIVar2);
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        pcVar1 = (this->mPath)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_508,pcVar1,pcVar1 + (this->mPath)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_508,local_508._M_string_length,0,'\x01');
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_508,(ulong)local_4c8._M_dataplus._M_p);
        local_530 = (undefined1  [8])local_520;
        psVar11 = (size_type *)(plVar7 + 2);
        local_4e8 = &local_4d8;
        if ((size_type *)*plVar7 == psVar11) {
          local_520._0_8_ = *psVar11;
          local_520._8_8_ = plVar7[3];
        }
        else {
          local_520._0_8_ = *psVar11;
          local_530 = (undefined1  [8])*plVar7;
        }
        local_528._M_p = (pointer)plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"wb","");
        iVar5 = (*pIVar2->_vptr_IOSystem[4])(pIVar2,local_530,local_4e8);
        file = (IOStream *)CONCAT44(extraout_var,iVar5);
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if (local_530 != (undefined1  [8])local_520) {
          operator_delete((void *)local_530,local_520._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if (file == (IOStream *)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_508,"could not open output texture file: ",local_448);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_530,&local_508,&local_4c8);
          std::runtime_error::runtime_error(this_00,(string *)local_530);
          *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (texture->mHeight == 0) {
          (*file->_vptr_IOStream[3])(file,texture->pcData,(ulong)texture->mWidth,1);
        }
        else {
          Bitmap::Save(texture,file);
        }
        (*file->_vptr_IOStream[7])(file);
        local_530._0_4_ = uVar17;
        local_528._M_p = local_520 + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_528,local_4c8._M_dataplus._M_p,
                   local_4c8._M_dataplus._M_p + local_4c8._M_string_length);
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<unsigned_int,std::__cxx11::string>>
                  (local_440,
                   (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_530);
        if (local_528._M_p != local_520 + 8) {
          operator_delete(local_528._M_p,local_520._8_8_ + 1);
        }
        (*file->_vptr_IOStream[1])(file);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
      }
      uVar18 = uVar18 + 1;
      paVar6 = this->mScene;
    } while (uVar18 < paVar6->mNumTextures);
  }
  return;
}

Assistant:

void ColladaExporter::WriteTextures() {
    static const unsigned int buffer_size = 1024;
    char str[buffer_size];

    if (mScene->HasTextures()) {
        for(unsigned int i = 0; i < mScene->mNumTextures; i++) {
            // It would be great to be able to create a directory in portable standard C++, but it's not the case,
            // so we just write the textures in the current directory.

            aiTexture* texture = mScene->mTextures[i];
            if ( nullptr == texture ) {
                continue;
            }

            ASSIMP_itoa10(str, buffer_size, i + 1);

            std::string name = mFile + "_texture_" + (i < 1000 ? "0" : "") + (i < 100 ? "0" : "") + (i < 10 ? "0" : "") + str + "." + ((const char*) texture->achFormatHint);

            std::unique_ptr<IOStream> outfile(mIOSystem->Open(mPath + mIOSystem->getOsSeparator() + name, "wb"));
            if(outfile == NULL) {
                throw DeadlyExportError("could not open output texture file: " + mPath + name);
            }

            if(texture->mHeight == 0) {
                outfile->Write((void*) texture->pcData, texture->mWidth, 1);
            } else {
                Bitmap::Save(texture, outfile.get());
            }

            outfile->Flush();

            textures.insert(std::make_pair(i, name));
        }
    }
}